

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sortFun.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  int c;
  int b;
  int a;
  int local_34;
  int local_30;
  int local_2c;
  
  std::operator<<((ostream *)&std::cout,"Please enter int a: ");
  std::istream::operator>>((istream *)&std::cin,&local_2c);
  std::operator<<((ostream *)&std::cout,"Please enter int b: ");
  std::istream::operator>>((istream *)&std::cin,&local_30);
  std::operator<<((ostream *)&std::cout,"Please enter int c: ");
  std::istream::operator>>((istream *)&std::cin,&local_34);
  sort3(&local_2c,&local_30,&local_34);
  poVar1 = std::operator<<((ostream *)&std::cout,"Sorted values: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_2c);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_30);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_34);
  std::endl<char,std::char_traits<char>>(poVar1);
  sort3(&local_34,&local_2c,&local_30);
  poVar1 = std::operator<<((ostream *)&std::cout,"Sorted values (c, a, b): ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_34);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_2c);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_30);
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int main()
{
    int a;
    int b;
    int c;

    cout << "Please enter int a: ";
    cin >> a;
    cout << "Please enter int b: ";
    cin >> b;
    cout << "Please enter int c: ";
    cin >> c;

    sort3(a, b, c);

    cout << "Sorted values: " << a << " " << b << " " << c << endl;

    sort3(c, a, b);

    cout << "Sorted values (c, a, b): " << c << " " << a << " " << b << endl;

}